

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::PlayerNameChanged(DPlayerMenu *this,FListMenuItem *li)

{
  char tail;
  int iVar1;
  char *pcVar2;
  FString command;
  char pp [16];
  
  pcVar2 = pp;
  iVar1 = (*li->_vptr_FListMenuItem[9])(li,0,pcVar2,0xf);
  if ((char)iVar1 == '\0') {
    return;
  }
  FString::FString(&command,"name \"");
  do {
    tail = *pcVar2;
    if ((tail == '\"') || (tail == '\\')) {
      FString::operator+=(&command,'\\');
      tail = *pcVar2;
    }
    else if (tail == '\0') {
      FString::operator+=(&command,'\"');
      C_DoCommand(command.Chars,0);
      FString::~FString(&command);
      return;
    }
    FString::operator+=(&command,tail);
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void DPlayerMenu::PlayerNameChanged(FListMenuItem *li)
{
	char pp[MAXPLAYERNAME+1];
	const char *p;
	if (li->GetString(0, pp, MAXPLAYERNAME))
	{
		FString command("name \"");

		// Escape any backslashes or quotation marks before sending the name to the console.
		for (p = pp; *p != '\0'; ++p)
		{
			if (*p == '"' || *p == '\\')
			{
				command << '\\';
			}
			command << *p;
		}
		command << '"';
		C_DoCommand (command);
	}
}